

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

bool Eval::loadPatterns(void)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  double dVar3;
  int local_234;
  int local_230;
  int i_1;
  int i;
  float value;
  long local_218;
  ifstream in;
  bool local_9;
  
  _Var2 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream(&local_218,"./pattern.bin",_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) == 0) {
    for (local_230 = 0; local_230 < 0x2b6371; local_230 = local_230 + 1) {
      std::istream::read((char *)&local_218,(long)&i_1);
      bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
      if ((bVar1 & 1) != 0) {
        std::ifstream::close();
        local_9 = false;
        goto LAB_00110875;
      }
      dVar3 = std::round((double)(ulong)(uint)((float)i_1 * 10000.0));
      patternValues[local_230] = (int)SUB84(dVar3,0);
    }
    for (local_234 = 0; local_234 < 0x11; local_234 = local_234 + 1) {
      std::istream::read((char *)&local_218,(long)&i_1);
      bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
      if ((bVar1 & 1) != 0) {
        std::ifstream::close();
        local_9 = false;
        goto LAB_00110875;
      }
      dVar3 = std::round((double)(ulong)(uint)i_1);
      patternCorrection[local_234] = (int)SUB84(dVar3,0);
    }
    std::ifstream::close();
    local_9 = true;
  }
  else {
    local_9 = false;
  }
LAB_00110875:
  i = 1;
  std::ifstream::~ifstream(&local_218);
  return local_9;
}

Assistant:

bool Eval::loadPatterns() {
    std::ifstream in("./pattern.bin", std::ios::binary | std::ios::in);
    if (!in) return false;
    float value;
    for (int i = 0; i < ALL_STAGE_PATTERN_COUNT; i++) {
        in.read((char*)&value, sizeof(value));
        if (!in) {
            in.close();
            return false;
        }
        patternValues[i] = (int)round(value * RULER);
    }
    for (int i = 0; i < STAGES; i++) {
        in.read((char*)&value, sizeof(value));
        if (!in) {
            in.close();
            return false;
        }
        patternCorrection[i] = (int)round(value);
    }
    in.close();
    return true;

}